

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O0

UChar32 __thiscall
icu_63::DataBuilderCollationIterator::nextCodePoint
          (DataBuilderCollationIterator *this,UErrorCode *param_1)

{
  int32_t iVar1;
  int iVar2;
  UChar32 c;
  UErrorCode *param_1_local;
  DataBuilderCollationIterator *this_local;
  
  iVar2 = this->pos;
  iVar1 = UnicodeString::length(this->s);
  if (iVar2 == iVar1) {
    this_local._4_4_ = 0xffffffff;
  }
  else {
    this_local._4_4_ = UnicodeString::char32At(this->s,this->pos);
    iVar2 = 2;
    if (this_local._4_4_ < 0x10000) {
      iVar2 = 1;
    }
    this->pos = iVar2 + this->pos;
  }
  return this_local._4_4_;
}

Assistant:

UChar32
DataBuilderCollationIterator::nextCodePoint(UErrorCode & /*errorCode*/) {
    if(pos == s->length()) {
        return U_SENTINEL;
    }
    UChar32 c = s->char32At(pos);
    pos += U16_LENGTH(c);
    return c;
}